

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O0

Status __thiscall leveldb::WriteBatch::Iterate(WriteBatch *this,Handler *handler)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long *in_RDX;
  Slice *in_RDI;
  char tag;
  int found;
  Slice value;
  Slice key;
  Slice input;
  string *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Slice *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  Slice *input_00;
  Slice local_f0 [2];
  Slice local_d0 [2];
  Slice local_b0 [2];
  Slice local_90 [2];
  char local_6d;
  int local_6c;
  Slice local_68;
  Slice local_58;
  Slice local_48 [2];
  Slice local_28;
  long *local_18;
  
  input_00 = in_RDI;
  local_18 = in_RDX;
  Slice::Slice((Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
  sVar4 = Slice::size(&local_28);
  if (sVar4 < 0xc) {
    Slice::Slice((Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (char *)in_stack_fffffffffffffed8);
    Slice::Slice(local_48);
    Status::Corruption(in_stack_fffffffffffffee8,
                       (Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  else {
    Slice::remove_prefix(&local_28,0xc);
    Slice::Slice(&local_58);
    Slice::Slice(&local_68);
    local_6c = 0;
    while (bVar1 = Slice::empty(&local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_6c = local_6c + 1;
      in_stack_fffffffffffffee8 = &local_28;
      local_6d = Slice::operator[](in_stack_fffffffffffffee8,0);
      Slice::remove_prefix(in_stack_fffffffffffffee8,1);
      iVar2 = (int)local_6d;
      if (local_6d == '\0') {
        bVar1 = GetLengthPrefixedSlice(input_00,(Slice *)CONCAT44(iVar2,in_stack_fffffffffffffef0));
        if (!bVar1) {
          Slice::Slice((Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (char *)in_stack_fffffffffffffed8);
          Slice::Slice(local_b0);
          Status::Corruption(in_stack_fffffffffffffee8,
                             (Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
          ;
          return (Status)(char *)in_RDI;
        }
        (**(code **)(*local_18 + 0x18))(local_18,&local_58);
      }
      else {
        if (iVar2 != 1) {
          Slice::Slice((Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (char *)in_stack_fffffffffffffed8);
          Slice::Slice(local_d0);
          Status::Corruption(in_stack_fffffffffffffee8,
                             (Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
          ;
          return (Status)(char *)in_RDI;
        }
        bVar1 = GetLengthPrefixedSlice(input_00,(Slice *)CONCAT44(1,in_stack_fffffffffffffef0));
        if ((!bVar1) ||
           (bVar1 = GetLengthPrefixedSlice
                              (input_00,(Slice *)CONCAT44(iVar2,in_stack_fffffffffffffef0)), !bVar1)
           ) {
          Slice::Slice((Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (char *)in_stack_fffffffffffffed8);
          Slice::Slice(local_90);
          Status::Corruption(in_stack_fffffffffffffee8,
                             (Slice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
          ;
          return (Status)(char *)in_RDI;
        }
        (**(code **)(*local_18 + 0x10))(local_18,&local_58,&local_68);
      }
    }
    iVar2 = local_6c;
    iVar3 = WriteBatchInternal::Count((WriteBatch *)0x10cb9e);
    if (iVar2 == iVar3) {
      Status::OK();
    }
    else {
      Slice::Slice((Slice *)CONCAT44(iVar2,in_stack_fffffffffffffee0),
                   (char *)in_stack_fffffffffffffed8);
      Slice::Slice(local_f0);
      Status::Corruption(in_stack_fffffffffffffee8,
                         (Slice *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status WriteBatch::Iterate(Handler* handler) const {
  Slice input(rep_);
  if (input.size() < kHeader) {
    return Status::Corruption("malformed WriteBatch (too small)");
  }

  input.remove_prefix(kHeader);
  Slice key, value;
  int found = 0;
  while (!input.empty()) {
    found++;
    char tag = input[0];
    input.remove_prefix(1);
    switch (tag) {
      case kTypeValue:
        if (GetLengthPrefixedSlice(&input, &key) &&
            GetLengthPrefixedSlice(&input, &value)) {
          handler->Put(key, value);
        } else {
          return Status::Corruption("bad WriteBatch Put");
        }
        break;
      case kTypeDeletion:
        if (GetLengthPrefixedSlice(&input, &key)) {
          handler->Delete(key);
        } else {
          return Status::Corruption("bad WriteBatch Delete");
        }
        break;
      default:
        return Status::Corruption("unknown WriteBatch tag");
    }
  }
  if (found != WriteBatchInternal::Count(this)) {
    return Status::Corruption("WriteBatch has wrong count");
  } else {
    return Status::OK();
  }
}